

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

char * dpfb::args::varNameToArgName(char *name)

{
  char cVar1;
  int iVar2;
  
  if (varNameToArgName(char_const*)::nameStr_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&varNameToArgName(char_const*)::nameStr_abi_cxx11_);
    if (iVar2 != 0) {
      varNameToArgName(char_const*)::nameStr_abi_cxx11_._M_dataplus._M_p =
           (pointer)&varNameToArgName(char_const*)::nameStr_abi_cxx11_.field_2;
      varNameToArgName(char_const*)::nameStr_abi_cxx11_._M_string_length = 0;
      varNameToArgName(char_const*)::nameStr_abi_cxx11_.field_2._M_local_buf[0] = '\0';
      __cxa_atexit(std::__cxx11::string::~string,&varNameToArgName(char_const*)::nameStr_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&varNameToArgName(char_const*)::nameStr_abi_cxx11_);
    }
  }
  varNameToArgName(char_const*)::nameStr_abi_cxx11_._M_string_length = 0;
  *varNameToArgName(char_const*)::nameStr_abi_cxx11_._M_dataplus._M_p = '\0';
  while( true ) {
    std::__cxx11::string::push_back('0');
    cVar1 = *name;
    if (cVar1 == '\0') break;
    name = name + 1;
    iVar2 = isupper((int)cVar1);
    if (iVar2 != 0) {
      std::__cxx11::string::push_back('0');
      tolower((int)cVar1);
    }
  }
  return varNameToArgName(char_const*)::nameStr_abi_cxx11_._M_dataplus._M_p;
}

Assistant:

static const char* varNameToArgName(const char* name)
{
    static std::string nameStr;
    nameStr.clear();

    nameStr += '-';

    while (*name) {
        const auto c = *name;
        ++name;

        if (std::isupper(c)) {
            nameStr += '-';
            nameStr += std::tolower(c);
        } else
            nameStr += c;
    }

    return nameStr.c_str();
}